

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  uint uVar1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  cmMakefile *this_00;
  _Alloc_hider _Var5;
  undefined8 __s;
  _Head_base<0UL,_cmCryptoHash_*,_false> this_01;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  cmValue cVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  char *pcVar12;
  string *psVar13;
  Status SVar14;
  long *plVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  char *extraout_RDX;
  char *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string *psVar18;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value_00;
  string_view arg;
  string_view separator;
  string_view value_01;
  string_view algo;
  cmValue tempPackageFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scripts;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> crypto;
  ostringstream cmCPackLog_msg;
  string hashFile;
  ostringstream cmCPackLog_msg_17;
  string filename;
  string findExpr;
  Glob gl;
  undefined1 auStack_4e8 [8];
  cmValue local_4e0;
  allocator<char> local_4d1;
  string local_4d0;
  undefined1 local_4b0 [32];
  _Head_base<0UL,_cmCryptoHash_*,_false> local_490;
  undefined1 local_488 [8];
  pointer local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  uint auStack_468 [20];
  ios_base local_418 [136];
  ios_base local_390 [264];
  long *local_288;
  long local_280;
  long local_278 [2];
  string local_268 [3];
  ios_base local_1f8 [264];
  string local_f0;
  string *local_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  string *local_b8;
  string *local_b0;
  string local_a8;
  Glob local_88;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_488,"Create package using ",0x15);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_488,(this->Name)._M_dataplus._M_p,
                      (this->Name)._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var5._M_p = local_268[0]._M_dataplus._M_p;
  sVar9 = strlen(local_268[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x40e,_Var5._M_p,sVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
    operator_delete(local_268[0]._M_dataplus._M_p,
                    CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                             local_268[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  iVar7 = PrepareNames(this);
  if (iVar7 == 0) {
    return 0;
  }
  iVar7 = (*this->_vptr_cmCPackGenerator[6])(this);
  if (iVar7 == 0) {
    return 0;
  }
  local_488 = (undefined1  [8])&local_478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,"CPACK_REMOVE_TOPLEVEL_DIRECTORY","");
  cVar10 = GetOption(this,(string *)local_488);
  if (cVar10.Value == (string *)0x0) {
    bVar6 = false;
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p;
    bVar6 = cmValue::IsOn((cmValue *)(cVar10.Value)->_M_string_length,value);
  }
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  paVar17 = &local_268[0].field_2;
  if (bVar6 != false) {
    local_488 = (undefined1  [8])&local_478;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"CPACK_TOPLEVEL_DIRECTORY","");
    cVar10 = GetOption(this,(string *)local_488);
    if (local_488 != (undefined1  [8])&local_478) {
      operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
    }
    psVar18 = cVar10.Value;
    if (cVar10.Value == (string *)0x0) {
      psVar18 = &cmValue::Empty_abi_cxx11_;
    }
    bVar6 = cmsys::SystemTools::FileExists(psVar18);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_488,"Remove toplevel directory: ",0x1b);
      poVar8 = operator<<((ostream *)local_488,cVar10);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_268[0]._M_dataplus._M_p;
      sVar9 = strlen(local_268[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x420,_Var5._M_p,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_268[0]._M_dataplus._M_p,
                        CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                 local_268[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
      std::ios_base::~ios_base(local_418);
      bVar6 = cmSystemTools::RepeatedRemoveDirectory(psVar18);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_488,"Problem removing toplevel directory: ",0x25);
        poVar8 = operator<<((ostream *)local_488,cVar10);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        _Var5._M_p = local_268[0]._M_dataplus._M_p;
        sVar9 = strlen(local_268[0]._M_dataplus._M_p);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x424,_Var5._M_p,sVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268[0]._M_dataplus._M_p != paVar17) {
          operator_delete(local_268[0]._M_dataplus._M_p,
                          CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                   local_268[0].field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
        std::ios_base::~ios_base(local_418);
        return 0;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_488,"About to install project ",0x19);
  std::ios::widen((char)(ostringstream *)local_488 + (char)*(undefined8 *)((long)local_488 + -0x18))
  ;
  std::ostream::put((char)local_488);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var5._M_p = local_268[0]._M_dataplus._M_p;
  sVar9 = strlen(local_268[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42a,_Var5._M_p,sVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != paVar17) {
    operator_delete(local_268[0]._M_dataplus._M_p,
                    CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                             local_268[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  iVar7 = InstallProject(this);
  if (iVar7 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_488,"Done install project ",0x15);
  std::ios::widen((char)(ostringstream *)local_488 + (char)*(undefined8 *)((long)local_488 + -0x18))
  ;
  std::ostream::put((char)local_488);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var5._M_p = local_268[0]._M_dataplus._M_p;
  sVar9 = strlen(local_268[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42f,_Var5._M_p,sVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != paVar17) {
    operator_delete(local_268[0]._M_dataplus._M_p,
                    CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                             local_268[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  local_488 = (undefined1  [8])&local_478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  local_4e0 = GetOption(this,(string *)local_488);
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  local_488 = (undefined1  [8])&local_478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,"CPACK_TEMPORARY_DIRECTORY","");
  psVar18 = (string *)GetOption(this,(string *)local_488);
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"Find files",10);
  std::ios::widen((char)(ostringstream *)local_488 + (char)*(undefined8 *)((long)local_488 + -0x18))
  ;
  std::ostream::put((char)local_488);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var5._M_p = local_268[0]._M_dataplus._M_p;
  sVar9 = strlen(local_268[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x435,_Var5._M_p,sVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != paVar17) {
    operator_delete(local_268[0]._M_dataplus._M_p,
                    CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                             local_268[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  cmsys::Glob::Glob(&local_88);
  if (psVar18 == (string *)0x0) {
    psVar18 = &cmValue::Empty_abi_cxx11_;
  }
  local_480 = (psVar18->_M_dataplus)._M_p;
  local_488 = (undefined1  [8])psVar18->_M_string_length;
  local_478._M_allocated_capacity = 2;
  local_478._8_8_ = (long)"prop_*/*" + 6;
  views._M_len = 2;
  views._M_array = (iterator)local_488;
  cmCatViews_abi_cxx11_(&local_a8,views);
  local_88.Recurse = true;
  local_88.RecurseListDirs = true;
  local_88.RecurseThroughSymlinks = false;
  bVar6 = cmsys::Glob::FindFiles(&local_88,&local_a8,(GlobMessages *)0x0);
  if (bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"Create package",0xe);
    std::ios::widen((char)(ostream *)local_488 + (char)*(undefined8 *)((long)local_488 + -0x18));
    std::ostream::put((char)local_488);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var5._M_p = local_268[0]._M_dataplus._M_p;
    sVar9 = strlen(local_268[0]._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x441,_Var5._M_p,sVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268[0]._M_dataplus._M_p != paVar17) {
      operator_delete(local_268[0]._M_dataplus._M_p,
                      CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                               local_268[0].field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
    std::ios_base::~ios_base(local_418);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_488,"Package files to: ",0x12);
    local_268[0]._M_dataplus._M_p = (pointer)paVar17;
    if (local_4e0.Value == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"(NULL)","");
    }
    else {
      pcVar3 = ((local_4e0.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,pcVar3,pcVar3 + (local_4e0.Value)->_M_string_length);
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_488,local_268[0]._M_dataplus._M_p,
                        local_268[0]._M_string_length);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268[0]._M_dataplus._M_p != paVar17) {
      operator_delete(local_268[0]._M_dataplus._M_p,
                      CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                               local_268[0].field_2._M_local_buf[0]) + 1);
    }
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var5._M_p = local_268[0]._M_dataplus._M_p;
    sVar9 = strlen(local_268[0]._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x445,_Var5._M_p,sVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268[0]._M_dataplus._M_p != paVar17) {
      operator_delete(local_268[0]._M_dataplus._M_p,
                      CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                               local_268[0].field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
    std::ios_base::~ios_base(local_418);
    psVar18 = local_4e0.Value;
    if (local_4e0.Value == (string *)0x0) {
      psVar18 = &cmValue::Empty_abi_cxx11_;
    }
    bVar6 = cmsys::SystemTools::FileExists(psVar18);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_488,"Remove old package file",0x17);
      std::ios::widen((char)(ostream *)local_488 + (char)*(undefined8 *)((long)local_488 + -0x18));
      std::ostream::put((char)local_488);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_268[0]._M_dataplus._M_p;
      sVar9 = strlen(local_268[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x448,_Var5._M_p,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_268[0]._M_dataplus._M_p,
                        CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                 local_268[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
      std::ios_base::~ios_base(local_418);
      psVar18 = local_4e0.Value;
      if (local_4e0.Value == (string *)0x0) {
        psVar18 = &cmValue::Empty_abi_cxx11_;
      }
      cmsys::SystemTools::RemoveFile(psVar18);
    }
    local_488 = (undefined1  [8])&local_478;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY","");
    cVar10 = GetOption(this,(string *)local_488);
    if (cVar10.Value == (string *)0x0) {
      bVar6 = false;
    }
    else {
      value_00._M_str = extraout_RDX_00;
      value_00._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p;
      bVar6 = cmValue::IsOn((cmValue *)(cVar10.Value)->_M_string_length,value_00);
    }
    if (local_488 != (undefined1  [8])&local_478) {
      operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
    }
    paVar17 = &local_268[0].field_2;
    if (bVar6 != false) {
      local_488 = (undefined1  [8])&local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"CPACK_TOPLEVEL_DIRECTORY","");
      GetOption(this,(string *)local_488);
      if (local_488 != (undefined1  [8])&local_478) {
        operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
      }
    }
    pvVar11 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->files,pvVar11);
    pvVar11 = &this->packageFileNames;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(pvVar11,(this->packageFileNames).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<cmValue&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar11,
               &local_4e0);
    std::__cxx11::string::_M_assign((string *)&this->toplevel);
    pcVar4 = this->MakefileMap;
    cmMakefile::PushScope(pcVar4);
    this_00 = this->MakefileMap;
    pcVar12 = cmVersion::GetCMakeVersion();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_488,pcVar12,(allocator<char> *)local_4b0);
    local_268[0]._M_string_length = 0;
    local_268[0].field_2._M_local_buf[0] = '\0';
    local_268[0]._M_dataplus._M_p = (pointer)paVar17;
    cmMakefile::SetPolicyVersion(this_00,(string *)local_488,local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268[0]._M_dataplus._M_p != paVar17) {
      operator_delete(local_268[0]._M_dataplus._M_p,
                      CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                               local_268[0].field_2._M_local_buf[0]) + 1);
    }
    if (local_488 != (undefined1  [8])&local_478) {
      operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
    }
    iVar7 = (*this->_vptr_cmCPackGenerator[9])(this);
    if ((((iVar7 == 0) || (cmSystemTools::s_ErrorOccurred != false)) ||
        (cmSystemTools::s_FatalErrorOccurred != false)) ||
       (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_488,"Problem compressing the directory",0x21);
      std::ios::widen((char)(ostream *)local_488 + (char)*(undefined8 *)((long)local_488 + -0x18));
      std::ostream::put((char)local_488);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_268[0]._M_dataplus._M_p;
      sVar9 = strlen(local_268[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x462,_Var5._M_p,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_268[0]._M_dataplus._M_p,
                        CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                 local_268[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
      std::ios_base::~ios_base(local_418);
      iVar7 = 0;
      cmMakefile::PopScope(pcVar4);
    }
    else {
      cmMakefile::PopScope(pcVar4);
      local_488 = (undefined1  [8])&local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"CPACK_POST_BUILD_SCRIPTS","");
      cVar10 = GetOption(this,(string *)local_488);
      if (local_488 != (undefined1  [8])&local_478) {
        operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
      }
      if (cVar10.Value != (string *)0x0) {
        pcVar4 = this->MakefileMap;
        local_488 = (undefined1  [8])&local_478;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,"CPACK_PACKAGE_FILES","");
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin(local_268,pvVar11,separator,(string_view)ZEXT816(0));
        value_01._M_str = local_268[0]._M_dataplus._M_p;
        value_01._M_len = local_268[0]._M_string_length;
        cmMakefile::AddDefinition(pcVar4,(string *)local_488,value_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268[0]._M_dataplus._M_p != paVar17) {
          operator_delete(local_268[0]._M_dataplus._M_p,
                          CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                   local_268[0].field_2._M_local_buf[0]) + 1);
        }
        if (local_488 != (undefined1  [8])&local_478) {
          operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
        }
        arg._M_str = ((cVar10.Value)->_M_dataplus)._M_p;
        arg._M_len = (cVar10.Value)->_M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4b0,arg,false);
        if (local_4b0._0_8_ != local_4b0._8_8_) {
          psVar18 = (string *)local_4b0._0_8_;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_488,"Executing post-build script: ",0x1d);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_488,(psVar18->_M_dataplus)._M_p,
                                psVar18->_M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_268[0]._M_dataplus._M_p;
            sVar9 = strlen(local_268[0]._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x46f,_Var5._M_p,sVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
              operator_delete(local_268[0]._M_dataplus._M_p,
                              CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                       local_268[0].field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
            std::ios_base::~ios_base(local_418);
            bVar6 = cmMakefile::ReadListFile(this->MakefileMap,psVar18);
            if (!bVar6) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"The post-build script not found: ",0x21);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_488,(psVar18->_M_dataplus)._M_p,
                                  psVar18->_M_string_length);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var5._M_p = local_268[0]._M_dataplus._M_p;
              sVar9 = strlen(local_268[0]._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x474,_Var5._M_p,sVar9);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                operator_delete(local_268[0]._M_dataplus._M_p,
                                CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                         local_268[0].field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
              std::ios_base::~ios_base(local_418);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4b0);
              goto LAB_0016a040;
            }
            psVar18 = psVar18 + 1;
          } while (psVar18 != (string *)local_4b0._8_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4b0);
      }
      local_488 = (undefined1  [8])&local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"CPACK_PACKAGE_CHECKSUM","");
      psVar18 = (string *)GetOption(this,(string *)local_488);
      if (local_488 != (undefined1  [8])&local_478) {
        operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
      }
      if (psVar18 == (string *)0x0) {
        psVar18 = &cmValue::Empty_abi_cxx11_;
      }
      algo._M_str = (char *)psVar18->_M_string_length;
      algo._M_len = (size_t)&local_490;
      cmCryptoHash::New(algo);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_488,"Copying final package(s) [",0x1a);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_488);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]:",2);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_268[0]._M_dataplus._M_p;
      sVar9 = strlen(local_268[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x486,_Var5._M_p,sVar9);
      local_b8 = psVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
        operator_delete(local_268[0]._M_dataplus._M_p,
                        CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                 local_268[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
      std::ios_base::~ios_base(local_418);
      psVar18 = (this->packageFileNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = (this->packageFileNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar18 != local_b0) {
        local_c0 = _VTT;
        local_c8 = _EVP_PKEY_get_bn_param;
        local_d0 = psVar18;
        do {
          paVar17 = &local_268[0].field_2;
          local_488 = (undefined1  [8])&local_478;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_488,"CPACK_OUTPUT_FILE_PREFIX","");
          psVar13 = (string *)GetOption(this,(string *)local_488);
          if (psVar13 == (string *)0x0) {
            psVar13 = &cmValue::Empty_abi_cxx11_;
          }
          local_4b0._0_8_ = local_4b0 + 0x10;
          pcVar3 = (psVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b0,pcVar3,pcVar3 + psVar13->_M_string_length);
          if (local_488 != (undefined1  [8])&local_478) {
            operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::GetFilenameName(&local_f0,psVar18);
          local_4e0.Value = local_d0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_488,"/",&local_f0);
          std::__cxx11::string::_M_append(local_4b0,(ulong)local_488);
          if (local_488 != (undefined1  [8])&local_478) {
            operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
          }
          __s = local_4b0._0_8_;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_488,"Copy final package(s): ",0x17);
          local_268[0]._M_dataplus._M_p = (pointer)paVar17;
          if (local_4e0.Value == (string *)0x0) {
            std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"(NULL)","");
          }
          else {
            pcVar3 = ((local_4e0.Value)->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_268,pcVar3,pcVar3 + (local_4e0.Value)->_M_string_length);
          }
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_488,local_268[0]._M_dataplus._M_p,
                              local_268[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," to ",4);
          pcVar12 = (char *)__s;
          if ((string *)__s == (string *)0x0) {
            pcVar12 = "(NULL)";
          }
          sVar9 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,sVar9);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268[0]._M_dataplus._M_p != paVar17) {
            operator_delete(local_268[0]._M_dataplus._M_p,
                            CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                     local_268[0].field_2._M_local_buf[0]) + 1);
          }
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_268[0]._M_dataplus._M_p;
          sVar9 = strlen(local_268[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x492,_Var5._M_p,sVar9);
          paVar17 = &local_268[0].field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268[0]._M_dataplus._M_p != paVar17) {
            operator_delete(local_268[0]._M_dataplus._M_p,
                            CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                     local_268[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
          std::ios_base::~ios_base(local_418);
          SVar14 = cmsys::SystemTools::CopyFileIfDifferent(psVar18,(string *)local_4b0);
          if (SVar14.Kind_ != Success) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_488,"Problem copying the package: ",0x1d);
            local_268[0]._M_dataplus._M_p = (pointer)paVar17;
            if (local_4e0.Value == (string *)0x0) {
              std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"(NULL)","");
            }
            else {
              pcVar3 = ((local_4e0.Value)->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_268,pcVar3,pcVar3 + (local_4e0.Value)->_M_string_length);
            }
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_488,local_268[0]._M_dataplus._M_p,
                                local_268[0]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," to ",4);
            sVar9 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,sVar9);
            std::endl<char,std::char_traits<char>>(poVar8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268[0]._M_dataplus._M_p != paVar17) {
              operator_delete(local_268[0]._M_dataplus._M_p,
                              CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                       local_268[0].field_2._M_local_buf[0]) + 1);
            }
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_268[0]._M_dataplus._M_p;
            sVar9 = strlen(local_268[0]._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x498,_Var5._M_p,sVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268[0]._M_dataplus._M_p != paVar17) {
              operator_delete(local_268[0]._M_dataplus._M_p,
                              CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                       local_268[0].field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
            std::ios_base::~ios_base(local_418);
LAB_0016b4cd:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((string *)local_4b0._0_8_ != (string *)(local_4b0 + 0x10)) {
              operator_delete((void *)local_4b0._0_8_,(ulong)(local_4b0._16_8_ + 1));
            }
            iVar7 = 0;
            goto LAB_0016b510;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"- package: ",0xb)
          ;
          if ((string *)__s == (string *)0x0) {
            std::ios::clear((int)(auStack_4e8 + *(long *)((long)local_488 + -0x18)) + 0x60);
          }
          else {
            sVar9 = strlen((char *)__s);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_488,(char *)__s,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488," generated.",0xb)
          ;
          std::ios::widen((char)*(undefined8 *)((long)local_488 + -0x18) + (char)local_488);
          std::ostream::put((char)local_488);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_268[0]._M_dataplus._M_p;
          sVar9 = strlen(local_268[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x49d,_Var5._M_p,sVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268[0]._M_dataplus._M_p != paVar17) {
            operator_delete(local_268[0]._M_dataplus._M_p,
                            CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                     local_268[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
          std::ios_base::~ios_base(local_418);
          if (local_490._M_head_impl != (cmCryptoHash *)0x0) {
            local_488 = (undefined1  [8])&local_478;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_488,"CPACK_OUTPUT_FILE_PREFIX","");
            psVar13 = (string *)GetOption(this,(string *)local_488);
            if (psVar13 == (string *)0x0) {
              psVar13 = &cmValue::Empty_abi_cxx11_;
            }
            local_288 = local_278;
            pcVar3 = (psVar13->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_288,pcVar3,pcVar3 + psVar13->_M_string_length);
            if (local_488 != (undefined1  [8])&local_478) {
              operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488,"/",&local_f0);
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_488);
            if (local_488 != (undefined1  [8])&local_478) {
              operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
            }
            cmsys::SystemTools::LowerCase(local_268,local_b8);
            plVar15 = (long *)std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,0x6d9ec0)
            ;
            local_488 = (undefined1  [8])&local_478;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 == paVar16) {
              local_478._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_478._8_8_ = plVar15[3];
            }
            else {
              local_478._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_488 = (undefined1  [8])*plVar15;
            }
            local_480 = (pointer)plVar15[1];
            *plVar15 = (long)paVar16;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_488);
            if (local_488 != (undefined1  [8])&local_478) {
              operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268[0]._M_dataplus._M_p != paVar17) {
              operator_delete(local_268[0]._M_dataplus._M_p,
                              CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                       local_268[0].field_2._M_local_buf[0]) + 1);
            }
            std::ofstream::ofstream(local_488,(char *)local_288,_S_out);
            this_01._M_head_impl = local_490._M_head_impl;
            uVar1 = *(uint *)((long)auStack_468 + *(long *)((long)local_488 + -0x18));
            if ((uVar1 & 5) == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4d0,(char *)__s,&local_4d1);
              cmCryptoHash::HashFile(local_268,this_01._M_head_impl,&local_4d0);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_488,local_268[0]._M_dataplus._M_p,
                                  local_268[0]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_f0._M_dataplus._M_p,local_f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                operator_delete(local_268[0]._M_dataplus._M_p,
                                CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                                         local_268[0].field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                operator_delete(local_4d0._M_dataplus._M_p,
                                local_4d0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,"- checksum file: ",0x11);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_268,(char *)local_288,local_280);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," generated.",0xb);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var5._M_p = local_4d0._M_dataplus._M_p;
              sVar9 = strlen(local_4d0._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x4ae,_Var5._M_p,sVar9);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,"Cannot create checksum file: ",0x1d);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_268,(char *)local_288,local_280);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var5._M_p = local_4d0._M_dataplus._M_p;
              sVar9 = strlen(local_4d0._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x4a8,_Var5._M_p,sVar9);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
            std::ios_base::~ios_base(local_1f8);
            local_488 = (undefined1  [8])local_c0;
            *(undefined8 *)(local_488 + (&local_c0->_M_allocated_capacity)[-3]) = local_c8;
            std::filebuf::~filebuf((filebuf *)&local_480);
            std::ios_base::~ios_base(local_390);
            if (local_288 != local_278) {
              operator_delete(local_288,local_278[0] + 1);
            }
            if ((uVar1 & 5) != 0) goto LAB_0016b4cd;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((string *)local_4b0._0_8_ != (string *)(local_4b0 + 0x10)) {
            operator_delete((void *)local_4b0._0_8_,(ulong)(local_4b0._16_8_ + 1));
          }
          psVar18 = psVar18 + 1;
          local_d0 = local_d0 + 1;
        } while (psVar18 != local_b0);
      }
      iVar7 = 1;
LAB_0016b510:
      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)&local_490);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_488,"Cannot find any files in the packaging tree",0x2b);
    std::ios::widen((char)(ostream *)local_488 + (char)*(undefined8 *)((long)local_488 + -0x18));
    std::ostream::put((char)local_488);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var5._M_p = local_268[0]._M_dataplus._M_p;
    sVar9 = strlen(local_268[0]._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x43d,_Var5._M_p,sVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268[0]._M_dataplus._M_p != paVar17) {
      operator_delete(local_268[0]._M_dataplus._M_p,
                      CONCAT71(local_268[0].field_2._M_allocated_capacity._1_7_,
                               local_268[0].field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
    std::ios_base::~ios_base(local_418);
LAB_0016a040:
    iVar7 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  return iVar7;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if (!this->PrepareNames()) {
    return 0;
  }

  // Digest Component grouping specification
  if (!this->PrepareGroupingKind()) {
    return 0;
  }

  if (cmIsOn(this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY"))) {
    cmValue toplevelDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if (cmSystemTools::FileExists(toplevelDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: " << toplevelDirectory
                                                  << std::endl);
      if (!cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem removing toplevel directory: "
                        << toplevelDirectory << std::endl);
        return 0;
      }
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if (!this->InstallProject()) {
    return 0;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Done install project " << std::endl);

  cmValue tempPackageFileName =
    this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  cmValue tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = cmStrCat(tempDirectory, "/*");
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the packaging tree" << std::endl);
    return 0;
  }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Package files to: "
                  << (tempPackageFileName ? *tempPackageFileName : "(NULL)")
                  << std::endl);
  if (cmSystemTools::FileExists(tempPackageFileName)) {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Remove old package file" << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
  }
  if (cmIsOn(this->GetOption("CPACK_INCLUDE_TOPLEVEL_DIRECTORY"))) {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  }

  // The files to be installed
  this->files = gl.GetFiles();

  this->packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  this->packageFileNames.emplace_back(tempPackageFileName);
  this->toplevel = *tempDirectory;
  { // scope that enables package generators to run internal scripts with
    // latest CMake policies enabled
    cmMakefile::ScopePushPop pp{ this->MakefileMap };
    this->MakefileMap->SetPolicyVersion(cmVersion::GetCMakeVersion(),
                                        std::string());

    if (!this->PackageFiles() || cmSystemTools::GetErrorOccurredFlag()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem compressing the directory" << std::endl);
      return 0;
    }
  }
  // Run post-build actions
  cmValue postBuildScripts = this->GetOption("CPACK_POST_BUILD_SCRIPTS");
  if (postBuildScripts) {
    this->MakefileMap->AddDefinition("CPACK_PACKAGE_FILES",
                                     cmJoin(this->packageFileNames, ";"));

    const auto scripts = cmExpandedList(postBuildScripts, false);
    for (const auto& script : scripts) {
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "Executing post-build script: " << script << std::endl);

      if (!this->MakefileMap->ReadListFile(script)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "The post-build script not found: " << script
                                                          << std::endl);
        return 0;
      }
    }
  }

  /* Prepare checksum algorithm*/
  cmValue algo = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  std::unique_ptr<cmCryptoHash> crypto = cmCryptoHash::New(*algo);

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Copying final package(s) [" << this->packageFileNames.size()
                                             << "]:" << std::endl);
  /* now copy package one by one */
  for (std::string const& pkgFileName : this->packageFileNames) {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    std::string filename(cmSystemTools::GetFilenameName(pkgFileName));
    tempPackageFileName = cmValue(pkgFileName);
    tmpPF += "/" + filename;
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Copy final package(s): "
                    << (tempPackageFileName ? *tempPackageFileName : "(NULL)")
                    << " to " << (packageFileName ? packageFileName : "(NULL)")
                    << std::endl);
    if (!cmSystemTools::CopyFileIfDifferent(pkgFileName, tmpPF)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "Problem copying the package: "
          << (tempPackageFileName ? *tempPackageFileName : "(NULL)") << " to "
          << (packageFileName ? packageFileName : "(NULL)") << std::endl);
      return 0;
    }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- package: " << packageFileName << " generated."
                                << std::endl);

    /* Generate checksum file */
    if (crypto) {
      std::string hashFile(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
      hashFile += "/" + filename;
      hashFile += "." + cmSystemTools::LowerCase(algo);
      cmsys::ofstream outF(hashFile.c_str());
      if (!outF) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot create checksum file: " << hashFile
                                                      << std::endl);
        return 0;
      }
      outF << crypto->HashFile(packageFileName) << "  " << filename << "\n";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- checksum file: " << hashFile << " generated."
                                        << std::endl);
    }
  }

  return 1;
}